

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_gc_mark_serialize_CALL(WorkerP *w,Task *__dq_head)

{
  avl_iter_t *iter;
  lddmc_ser *plVar1;
  Task *__dq_head_local;
  WorkerP *w_local;
  avl_iter_t *it;
  lddmc_ser *s;
  
  iter = lddmc_ser_iter(lddmc_ser_set);
  while( true ) {
    plVar1 = lddmc_ser_iter_next(iter);
    if (plVar1 == (lddmc_ser *)0x0) break;
    lddmc_gc_mark_rec_CALL(w,__dq_head,plVar1->mdd);
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(lddmc_gc_mark_serialize)
{
    struct lddmc_ser *s;
    avl_iter_t *it = lddmc_ser_iter(lddmc_ser_set);

    /* Iterate through nodes in serialization */
    while ((s=lddmc_ser_iter_next(it))) {
        CALL(lddmc_gc_mark_rec, s->mdd);
    }
}